

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::SSLClient::process_socket
          (SSLClient *this,Socket *socket,function<bool_(httplib::Stream_&)> *callback)

{
  socket_t sock;
  SSL *ssl;
  time_t read_timeout_sec;
  time_t read_timeout_usec;
  time_t write_timeout_sec;
  time_t write_timeout_usec;
  function<bool_(httplib::Stream_&)> callback_00;
  bool bVar1;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 uVar2;
  undefined8 uVar3;
  
  ssl = socket->ssl;
  sock = socket->sock;
  read_timeout_sec = (this->super_ClientImpl).read_timeout_sec_;
  read_timeout_usec = (this->super_ClientImpl).read_timeout_usec_;
  write_timeout_sec = (this->super_ClientImpl).write_timeout_sec_;
  write_timeout_usec = (this->super_ClientImpl).write_timeout_usec_;
  uVar2 = (_Manager_type)0x0;
  uVar3 = (_Invoker_type)0x0;
  if ((callback->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar2 = *(undefined8 *)&(callback->super__Function_base)._M_functor;
    uVar3 = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
    (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    callback->_M_invoker = (_Invoker_type)0x0;
  }
  callback_00.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffffd0;
  callback_00.super__Function_base._M_functor._M_unused._M_object = &stack0xffffffffffffffd8;
  callback_00.super__Function_base._M_manager = (_Manager_type)uVar2;
  callback_00._M_invoker = (_Invoker_type)uVar3;
  bVar1 = detail::process_client_socket_ssl<std::function<bool(httplib::Stream&)>>
                    (ssl,sock,read_timeout_sec,read_timeout_usec,write_timeout_sec,
                     write_timeout_usec,callback_00);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffffd8);
  return bVar1;
}

Assistant:

inline bool
        SSLClient::process_socket(const Socket & socket,
            std::function<bool(Stream& strm)> callback) {
        assert(socket.ssl);
        return detail::process_client_socket_ssl(
            socket.ssl, socket.sock, read_timeout_sec_, read_timeout_usec_,
            write_timeout_sec_, write_timeout_usec_, std::move(callback));
    }